

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgkcl(char *tcard)

{
  int iVar1;
  char *in_RDI;
  char *card5;
  char *card1;
  char card [20];
  int local_418;
  int local_414;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  char local_28;
  char local_27;
  char local_26;
  char local_25;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  char *local_10;
  
  local_28 = '\0';
  local_10 = in_RDI;
  strncat(&local_28,in_RDI,8);
  strcat(&local_28,"        ");
  ffupch((char *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  if (local_28 == 'Z') {
    if (local_27 < 'I') {
      local_3c = -1;
    }
    else {
      if (local_27 < 'J') {
        local_40 = strncmp(&local_27,"IMAGE  ",7);
      }
      else {
        local_40 = 1;
      }
      local_3c = local_40;
    }
    if (local_3c == 0) {
      return 0x14;
    }
    if (local_27 < 'C') {
      local_44 = -1;
    }
    else {
      if (local_27 < 'D') {
        local_48 = strncmp(&local_27,"CMPTYPE",7);
      }
      else {
        local_48 = 1;
      }
      local_44 = local_48;
    }
    if (local_44 == 0) {
      return 0x14;
    }
    if (local_27 < 'N') {
      local_4c = -1;
    }
    else {
      if (local_27 < 'O') {
        local_50 = strncmp(&local_27,"NAME",4);
      }
      else {
        local_50 = 1;
      }
      local_4c = local_50;
    }
    if (local_4c == 0) {
      if (('/' < local_23) && (local_23 < ':')) {
        return 0x14;
      }
    }
    else {
      if (local_27 < 'V') {
        local_54 = -1;
      }
      else {
        if (local_27 < 'W') {
          local_58 = strncmp(&local_27,"VAL",3);
        }
        else {
          local_58 = 1;
        }
        local_54 = local_58;
      }
      if (local_54 == 0) {
        if (('/' < local_24) && (local_24 < ':')) {
          return 0x14;
        }
      }
      else {
        if (local_27 < 'T') {
          local_5c = -1;
        }
        else {
          if (local_27 < 'U') {
            local_60 = strncmp(&local_27,"TILE",4);
          }
          else {
            local_60 = 1;
          }
          local_5c = local_60;
        }
        if (local_5c == 0) {
          if (('/' < local_23) && (local_23 < ':')) {
            return 0x14;
          }
        }
        else {
          if (local_27 < 'B') {
            local_64 = -1;
          }
          else {
            if (local_27 < 'C') {
              local_68 = strncmp(&local_27,"BITPIX ",7);
            }
            else {
              local_68 = 1;
            }
            local_64 = local_68;
          }
          if (local_64 == 0) {
            return 0x14;
          }
          if (local_27 < 'N') {
            local_6c = -1;
          }
          else {
            if (local_27 < 'O') {
              local_70 = strncmp(&local_27,"NAXIS",5);
            }
            else {
              local_70 = 1;
            }
            local_6c = local_70;
          }
          if (local_6c == 0) {
            if ((('/' < local_22) && (local_22 < ':')) || (local_22 == ' ')) {
              return 0x14;
            }
          }
          else {
            if (local_27 < 'S') {
              local_74 = -1;
            }
            else {
              if (local_27 < 'T') {
                local_78 = strncmp(&local_27,"SCALE  ",7);
              }
              else {
                local_78 = 1;
              }
              local_74 = local_78;
            }
            if (local_74 == 0) {
              return 0x14;
            }
            if (local_27 < 'Z') {
              local_7c = -1;
            }
            else {
              if (local_27 < '[') {
                local_80 = strncmp(&local_27,"ZERO   ",7);
              }
              else {
                local_80 = 1;
              }
              local_7c = local_80;
            }
            if (local_7c == 0) {
              return 0x14;
            }
            if (local_27 < 'B') {
              local_84 = -1;
            }
            else {
              if (local_27 < 'C') {
                local_88 = strncmp(&local_27,"BLANK  ",7);
              }
              else {
                local_88 = 1;
              }
              local_84 = local_88;
            }
            if (local_84 == 0) {
              return 0x14;
            }
            if (local_27 < 'S') {
              local_8c = -1;
            }
            else {
              if (local_27 < 'T') {
                local_90 = strncmp(&local_27,"SIMPLE ",7);
              }
              else {
                local_90 = 1;
              }
              local_8c = local_90;
            }
            if (local_8c == 0) {
              return 0x14;
            }
            if (local_27 < 'T') {
              local_94 = -1;
            }
            else {
              if (local_27 < 'U') {
                local_98 = strncmp(&local_27,"TENSION",7);
              }
              else {
                local_98 = 1;
              }
              local_94 = local_98;
            }
            if (local_94 == 0) {
              return 0x14;
            }
            if (local_27 < 'E') {
              local_9c = -1;
            }
            else {
              if (local_27 < 'F') {
                local_a0 = strncmp(&local_27,"EXTEND ",7);
              }
              else {
                local_a0 = 1;
              }
              local_9c = local_a0;
            }
            if (local_9c == 0) {
              return 0x14;
            }
            if (local_27 < 'B') {
              local_a4 = -1;
            }
            else {
              if (local_27 < 'C') {
                local_a8 = strncmp(&local_27,"BLOCKED",7);
              }
              else {
                local_a8 = 1;
              }
              local_a4 = local_a8;
            }
            if (local_a4 == 0) {
              return 0x14;
            }
            if (local_27 < 'P') {
              local_ac = -1;
            }
            else {
              if (local_27 < 'Q') {
                local_b0 = strncmp(&local_27,"PCOUNT ",7);
              }
              else {
                local_b0 = 1;
              }
              local_ac = local_b0;
            }
            if (local_ac == 0) {
              return 0x14;
            }
            if (local_27 < 'G') {
              local_b4 = -1;
            }
            else {
              if (local_27 < 'H') {
                local_b8 = strncmp(&local_27,"GCOUNT ",7);
              }
              else {
                local_b8 = 1;
              }
              local_b4 = local_b8;
            }
            if (local_b4 == 0) {
              return 0x14;
            }
            if (local_27 < 'Q') {
              local_bc = -1;
            }
            else {
              if (local_27 < 'R') {
                local_c0 = strncmp(&local_27,"QUANTIZ",7);
              }
              else {
                local_c0 = 1;
              }
              local_bc = local_c0;
            }
            if (local_bc == 0) {
              return 0x14;
            }
            if (local_27 < 'D') {
              local_c4 = -1;
            }
            else {
              if (local_27 < 'E') {
                local_c8 = strncmp(&local_27,"DITHER0",7);
              }
              else {
                local_c8 = 1;
              }
              local_c4 = local_c8;
            }
            if (local_c4 == 0) {
              return 0x14;
            }
          }
        }
      }
    }
  }
  else {
    if (local_28 == ' ') {
      return 0x82;
    }
    if (local_28 == 'B') {
      if (local_27 < 'I') {
        local_cc = -1;
      }
      else {
        if (local_27 < 'J') {
          local_d0 = strncmp(&local_27,"ITPIX  ",7);
        }
        else {
          local_d0 = 1;
        }
        local_cc = local_d0;
      }
      if (local_cc == 0) {
        return 10;
      }
      if (local_27 < 'L') {
        local_d4 = -1;
      }
      else {
        if (local_27 < 'M') {
          local_d8 = strncmp(&local_27,"LOCKED ",7);
        }
        else {
          local_d8 = 1;
        }
        local_d4 = local_d8;
      }
      if (local_d4 == 0) {
        return 10;
      }
      if (local_27 < 'L') {
        local_dc = -1;
      }
      else {
        if (local_27 < 'M') {
          local_e0 = strncmp(&local_27,"LANK   ",7);
        }
        else {
          local_e0 = 1;
        }
        local_dc = local_e0;
      }
      if (local_dc == 0) {
        return 0x28;
      }
      if (local_27 < 'S') {
        local_e4 = -1;
      }
      else {
        if (local_27 < 'T') {
          local_e8 = strncmp(&local_27,"SCALE  ",7);
        }
        else {
          local_e8 = 1;
        }
        local_e4 = local_e8;
      }
      if (local_e4 == 0) {
        return 0x1e;
      }
      if (local_27 < 'Z') {
        local_ec = -1;
      }
      else {
        if (local_27 < '[') {
          local_f0 = strncmp(&local_27,"ZERO   ",7);
        }
        else {
          local_f0 = 1;
        }
        local_ec = local_f0;
      }
      if (local_ec == 0) {
        return 0x1e;
      }
      if (local_27 < 'U') {
        local_f4 = -1;
      }
      else {
        if (local_27 < 'V') {
          local_f8 = strncmp(&local_27,"UNIT   ",7);
        }
        else {
          local_f8 = 1;
        }
        local_f4 = local_f8;
      }
      if (local_f4 == 0) {
        return 0x46;
      }
    }
    else if (local_28 == 'C') {
      if (local_27 < 'O') {
        local_fc = -1;
      }
      else {
        if (local_27 < 'P') {
          local_100 = strncmp(&local_27,"OMMENT",6);
        }
        else {
          local_100 = 1;
        }
        local_fc = local_100;
      }
      if (local_fc == 0) {
        if (*local_10 < 'C') {
          local_104 = -1;
        }
        else {
          if (*local_10 < 'D') {
            local_108 = strncmp(local_10,"COMMENT   and Astrophysics\', volume 376, page 3",0x2f);
          }
          else {
            local_108 = 1;
          }
          local_104 = local_108;
        }
        if (local_104 == 0) {
          return 10;
        }
        if (*local_10 < 'C') {
          local_10c = -1;
        }
        else {
          if (*local_10 < 'D') {
            local_110 = strncmp(local_10,"COMMENT   FITS (Flexible Image Transport System",0x2f);
          }
          else {
            local_110 = 1;
          }
          local_10c = local_110;
        }
        if (local_10c == 0) {
          return 10;
        }
        if (*local_10 < 'C') {
          local_114 = -1;
        }
        else {
          if (*local_10 < 'D') {
            local_118 = strncmp(local_10,"COMMENT   Astrophysics Supplement Series v44/p3",0x2f);
          }
          else {
            local_118 = 1;
          }
          local_114 = local_118;
        }
        if (local_114 == 0) {
          return 10;
        }
        if (*local_10 < 'C') {
          local_11c = -1;
        }
        else {
          if (*local_10 < 'D') {
            local_120 = strncmp(local_10,"COMMENT   Contact the NASA Science Office of St",0x2f);
          }
          else {
            local_120 = 1;
          }
          local_11c = local_120;
        }
        if (local_11c == 0) {
          return 10;
        }
        if (*local_10 < 'C') {
          local_124 = -1;
        }
        else {
          if (*local_10 < 'D') {
            local_128 = strncmp(local_10,"COMMENT   FITS Definition document #100 and oth",0x2f);
          }
          else {
            local_128 = 1;
          }
          local_124 = local_128;
        }
        if (local_124 == 0) {
          return 10;
        }
        if (local_21 == ' ') {
          return 0x82;
        }
        return 0x96;
      }
      if (local_27 < 'H') {
        local_12c = -1;
      }
      else {
        if (local_27 < 'I') {
          local_130 = strncmp(&local_27,"HECKSUM",7);
        }
        else {
          local_130 = 1;
        }
        local_12c = local_130;
      }
      if (local_12c == 0) {
        return 100;
      }
      if (local_27 < 'O') {
        local_134 = -1;
      }
      else {
        if (local_27 < 'P') {
          local_138 = strncmp(&local_27,"ONTINUE",7);
        }
        else {
          local_138 = 1;
        }
        local_134 = local_138;
      }
      if (local_134 == 0) {
        return 0x8c;
      }
      if (local_27 < 'T') {
        local_13c = -1;
      }
      else {
        if (local_27 < 'U') {
          local_140 = strncmp(&local_27,"TYPE",4);
        }
        else {
          local_140 = 1;
        }
        local_13c = local_140;
      }
      if (local_13c == 0) {
        if (('/' < local_23) && (local_23 < ':')) {
          return 0x6e;
        }
      }
      else {
        if (local_27 < 'U') {
          local_144 = -1;
        }
        else {
          if (local_27 < 'V') {
            local_148 = strncmp(&local_27,"UNIT",4);
          }
          else {
            local_148 = 1;
          }
          local_144 = local_148;
        }
        if (local_144 == 0) {
          if (('/' < local_23) && (local_23 < ':')) {
            return 0x6e;
          }
        }
        else {
          if (local_27 < 'R') {
            local_14c = -1;
          }
          else {
            if (local_27 < 'S') {
              local_150 = strncmp(&local_27,"RVAL",4);
            }
            else {
              local_150 = 1;
            }
            local_14c = local_150;
          }
          if (local_14c == 0) {
            if (('/' < local_23) && (local_23 < ':')) {
              return 0x6e;
            }
          }
          else {
            if (local_27 < 'R') {
              local_154 = -1;
            }
            else {
              if (local_27 < 'S') {
                local_158 = strncmp(&local_27,"RPIX",4);
              }
              else {
                local_158 = 1;
              }
              local_154 = local_158;
            }
            if (local_154 == 0) {
              if (('/' < local_23) && (local_23 < ':')) {
                return 0x6e;
              }
            }
            else {
              if (local_27 < 'R') {
                local_15c = -1;
              }
              else {
                if (local_27 < 'S') {
                  local_160 = strncmp(&local_27,"ROTA",4);
                }
                else {
                  local_160 = 1;
                }
                local_15c = local_160;
              }
              if (local_15c == 0) {
                if (('/' < local_23) && (local_23 < ':')) {
                  return 0x6e;
                }
              }
              else {
                if (local_27 < 'R') {
                  local_164 = -1;
                }
                else {
                  if (local_27 < 'S') {
                    local_168 = strncmp(&local_27,"RDER",4);
                  }
                  else {
                    local_168 = 1;
                  }
                  local_164 = local_168;
                }
                if (local_164 == 0) {
                  if (('/' < local_23) && (local_23 < ':')) {
                    return 0x6e;
                  }
                }
                else {
                  if (local_27 < 'S') {
                    local_16c = -1;
                  }
                  else {
                    if (local_27 < 'T') {
                      local_170 = strncmp(&local_27,"SYER",4);
                    }
                    else {
                      local_170 = 1;
                    }
                    local_16c = local_170;
                  }
                  if (local_16c == 0) {
                    if (('/' < local_23) && (local_23 < ':')) {
                      return 0x6e;
                    }
                  }
                  else {
                    if (local_27 < 'D') {
                      local_174 = -1;
                    }
                    else {
                      if (local_27 < 'E') {
                        local_178 = strncmp(&local_27,"DELT",4);
                      }
                      else {
                        local_178 = 1;
                      }
                      local_174 = local_178;
                    }
                    if (local_174 == 0) {
                      if (('/' < local_23) && (local_23 < ':')) {
                        return 0x6e;
                      }
                    }
                    else if (((local_27 == 'D') && ('/' < local_26)) && (local_26 < ':')) {
                      return 0x6e;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (local_28 == 'D') {
      if (local_27 < 'A') {
        local_17c = -1;
      }
      else {
        if (local_27 < 'B') {
          local_180 = strncmp(&local_27,"ATASUM ",7);
        }
        else {
          local_180 = 1;
        }
        local_17c = local_180;
      }
      if (local_17c == 0) {
        return 100;
      }
      if (local_27 < 'A') {
        local_184 = -1;
      }
      else {
        if (local_27 < 'B') {
          local_188 = strncmp(&local_27,"ATAMIN ",7);
        }
        else {
          local_188 = 1;
        }
        local_184 = local_188;
      }
      if (local_184 == 0) {
        return 0x3c;
      }
      if (local_27 < 'A') {
        local_18c = -1;
      }
      else {
        if (local_27 < 'B') {
          local_190 = strncmp(&local_27,"ATAMAX ",7);
        }
        else {
          local_190 = 1;
        }
        local_18c = local_190;
      }
      if (local_18c == 0) {
        return 0x3c;
      }
      if (local_27 < 'A') {
        local_194 = -1;
      }
      else {
        if (local_27 < 'B') {
          local_198 = strncmp(&local_27,"ATE-OBS",7);
        }
        else {
          local_198 = 1;
        }
        local_194 = local_198;
      }
      if (local_194 == 0) {
        return 0x78;
      }
    }
    else if (local_28 == 'E') {
      if (local_27 < 'X') {
        local_19c = -1;
      }
      else {
        if (local_27 < 'Y') {
          local_1a0 = strncmp(&local_27,"XTEND  ",7);
        }
        else {
          local_1a0 = 1;
        }
        local_19c = local_1a0;
      }
      if (local_19c == 0) {
        return 10;
      }
      if (local_27 < 'N') {
        local_1a4 = -1;
      }
      else {
        if (local_27 < 'O') {
          local_1a8 = strncmp(&local_27,"ND     ",7);
        }
        else {
          local_1a8 = 1;
        }
        local_1a4 = local_1a8;
      }
      if (local_1a4 == 0) {
        return 10;
      }
      if (local_27 < 'X') {
        local_1ac = -1;
      }
      else {
        if (local_27 < 'Y') {
          local_1b0 = strncmp(&local_27,"XTNAME ",7);
        }
        else {
          local_1b0 = 1;
        }
        local_1ac = local_1b0;
      }
      if (local_1ac == 0) {
        if (*local_10 < 'E') {
          local_1b4 = -1;
        }
        else {
          if (*local_10 < 'F') {
            local_1b8 = strncmp(local_10,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c);
          }
          else {
            local_1b8 = 1;
          }
          local_1b4 = local_1b8;
        }
        if (local_1b4 == 0) {
          return 0x14;
        }
        return 0x5a;
      }
      if (local_27 < 'X') {
        local_1bc = -1;
      }
      else {
        if (local_27 < 'Y') {
          local_1c0 = strncmp(&local_27,"XTVER  ",7);
        }
        else {
          local_1c0 = 1;
        }
        local_1bc = local_1c0;
      }
      if (local_1bc == 0) {
        return 0x5a;
      }
      if (local_27 < 'X') {
        local_1c4 = -1;
      }
      else {
        if (local_27 < 'Y') {
          local_1c8 = strncmp(&local_27,"XTLEVEL",7);
        }
        else {
          local_1c8 = 1;
        }
        local_1c4 = local_1c8;
      }
      if (local_1c4 == 0) {
        return 0x5a;
      }
      if (local_27 < 'Q') {
        local_1cc = -1;
      }
      else {
        if (local_27 < 'R') {
          local_1d0 = strncmp(&local_27,"QUINOX",6);
        }
        else {
          local_1d0 = 1;
        }
        local_1cc = local_1d0;
      }
      if (local_1cc == 0) {
        return 0x78;
      }
      if (local_27 < 'Q') {
        local_1d4 = -1;
      }
      else {
        if (local_27 < 'R') {
          local_1d8 = strncmp(&local_27,"QUI",3);
        }
        else {
          local_1d8 = 1;
        }
        local_1d4 = local_1d8;
      }
      if (((local_1d4 == 0) && ('/' < local_24)) && (local_24 < ':')) {
        return 0x78;
      }
      if (local_27 < 'P') {
        local_1dc = -1;
      }
      else {
        if (local_27 < 'Q') {
          local_1e0 = strncmp(&local_27,"POCH   ",7);
        }
        else {
          local_1e0 = 1;
        }
        local_1dc = local_1e0;
      }
      if (local_1dc == 0) {
        return 0x78;
      }
    }
    else if (local_28 == 'G') {
      if (local_27 < 'C') {
        local_1e4 = -1;
      }
      else {
        if (local_27 < 'D') {
          local_1e8 = strncmp(&local_27,"COUNT  ",7);
        }
        else {
          local_1e8 = 1;
        }
        local_1e4 = local_1e8;
      }
      if (local_1e4 == 0) {
        return 10;
      }
      if (local_27 < 'R') {
        local_1ec = -1;
      }
      else {
        if (local_27 < 'S') {
          local_1f0 = strncmp(&local_27,"ROUPS  ",7);
        }
        else {
          local_1f0 = 1;
        }
        local_1ec = local_1f0;
      }
      if (local_1ec == 0) {
        return 10;
      }
    }
    else if (local_28 == 'H') {
      if (local_27 < 'D') {
        local_1f4 = -1;
      }
      else {
        if (local_27 < 'E') {
          local_1f8 = strncmp(&local_27,"DUNAME ",7);
        }
        else {
          local_1f8 = 1;
        }
        local_1f4 = local_1f8;
      }
      if (local_1f4 == 0) {
        return 0x5a;
      }
      if (local_27 < 'D') {
        local_1fc = -1;
      }
      else {
        if (local_27 < 'E') {
          local_200 = strncmp(&local_27,"DUVER  ",7);
        }
        else {
          local_200 = 1;
        }
        local_1fc = local_200;
      }
      if (local_1fc == 0) {
        return 0x5a;
      }
      if (local_27 < 'D') {
        local_204 = -1;
      }
      else {
        if (local_27 < 'E') {
          local_208 = strncmp(&local_27,"DULEVEL",7);
        }
        else {
          local_208 = 1;
        }
        local_204 = local_208;
      }
      if (local_204 == 0) {
        return 0x5a;
      }
      if (local_27 < 'I') {
        local_20c = -1;
      }
      else {
        if (local_27 < 'J') {
          local_210 = strncmp(&local_27,"ISTORY",6);
        }
        else {
          local_210 = 1;
        }
        local_20c = local_210;
      }
      if (local_20c == 0) {
        if (local_21 == ' ') {
          return 0x82;
        }
        return 0x96;
      }
    }
    else if (local_28 == 'L') {
      if (local_27 < 'O') {
        local_214 = -1;
      }
      else {
        if (local_27 < 'P') {
          local_218 = strncmp(&local_27,"ONPOLE",6);
        }
        else {
          local_218 = 1;
        }
        local_214 = local_218;
      }
      if (local_214 == 0) {
        return 0x6e;
      }
      if (local_27 < 'A') {
        local_21c = -1;
      }
      else {
        if (local_27 < 'B') {
          local_220 = strncmp(&local_27,"ATPOLE",6);
        }
        else {
          local_220 = 1;
        }
        local_21c = local_220;
      }
      if (local_21c == 0) {
        return 0x6e;
      }
      if (local_27 < 'O') {
        local_224 = -1;
      }
      else {
        if (local_27 < 'P') {
          local_228 = strncmp(&local_27,"ONP",3);
        }
        else {
          local_228 = 1;
        }
        local_224 = local_228;
      }
      if (local_224 == 0) {
        if (('/' < local_24) && (local_24 < ':')) {
          return 0x6e;
        }
      }
      else {
        if (local_27 < 'A') {
          local_22c = -1;
        }
        else {
          if (local_27 < 'B') {
            local_230 = strncmp(&local_27,"ATP",3);
          }
          else {
            local_230 = 1;
          }
          local_22c = local_230;
        }
        if (((local_22c == 0) && ('/' < local_24)) && (local_24 < ':')) {
          return 0x6e;
        }
      }
    }
    else if (local_28 == 'M') {
      if (local_27 < 'J') {
        local_234 = -1;
      }
      else {
        if (local_27 < 'K') {
          local_238 = strncmp(&local_27,"JD-OBS ",7);
        }
        else {
          local_238 = 1;
        }
        local_234 = local_238;
      }
      if (local_234 == 0) {
        return 0x78;
      }
      if (local_27 < 'J') {
        local_23c = -1;
      }
      else {
        if (local_27 < 'K') {
          local_240 = strncmp(&local_27,"JDOB",4);
        }
        else {
          local_240 = 1;
        }
        local_23c = local_240;
      }
      if (((local_23c == 0) && ('/' < local_23)) && (local_23 < ':')) {
        return 0x78;
      }
    }
    else if (local_28 == 'N') {
      if (local_27 < 'A') {
        local_244 = -1;
      }
      else {
        if (local_27 < 'B') {
          local_248 = strncmp(&local_27,"AXIS",4);
        }
        else {
          local_248 = 1;
        }
        local_244 = local_248;
      }
      if ((local_244 == 0) && ((('/' < local_23 && (local_23 < ':')) || (local_23 == ' ')))) {
        return 10;
      }
    }
    else if (local_28 == 'P') {
      if (local_27 < 'C') {
        local_24c = -1;
      }
      else {
        if (local_27 < 'D') {
          local_250 = strncmp(&local_27,"COUNT  ",7);
        }
        else {
          local_250 = 1;
        }
        local_24c = local_250;
      }
      if (local_24c == 0) {
        return 10;
      }
      if (local_27 == 'C') {
        if (('/' < local_26) && (local_26 < ':')) {
          return 0x6e;
        }
      }
      else if (local_27 == 'V') {
        if (('/' < local_26) && (local_26 < ':')) {
          return 0x6e;
        }
      }
      else if (((local_27 == 'S') && ('/' < local_26)) && (local_26 < ':')) {
        return 0x6e;
      }
    }
    else if (local_28 == 'R') {
      if (local_27 < 'A') {
        local_254 = -1;
      }
      else {
        if (local_27 < 'B') {
          local_258 = strncmp(&local_27,"ADECSYS",7);
        }
        else {
          local_258 = 1;
        }
        local_254 = local_258;
      }
      if (local_254 == 0) {
        return 0x78;
      }
      if (local_27 < 'A') {
        local_25c = -1;
      }
      else {
        if (local_27 < 'B') {
          local_260 = strncmp(&local_27,"ADESYS",6);
        }
        else {
          local_260 = 1;
        }
        local_25c = local_260;
      }
      if (local_25c == 0) {
        return 0x78;
      }
      if (local_27 < 'A') {
        local_264 = -1;
      }
      else {
        if (local_27 < 'B') {
          local_268 = strncmp(&local_27,"ADE",3);
        }
        else {
          local_268 = 1;
        }
        local_264 = local_268;
      }
      if (((local_264 == 0) && ('/' < local_24)) && (local_24 < ':')) {
        return 0x78;
      }
    }
    else if (local_28 == 'S') {
      if (local_27 < 'I') {
        local_26c = -1;
      }
      else {
        if (local_27 < 'J') {
          local_270 = strncmp(&local_27,"IMPLE  ",7);
        }
        else {
          local_270 = 1;
        }
        local_26c = local_270;
      }
      if (local_26c == 0) {
        return 10;
      }
    }
    else if (local_28 == 'T') {
      if (local_27 < 'T') {
        local_274 = -1;
      }
      else {
        if (local_27 < 'U') {
          local_278 = strncmp(&local_27,"TYPE",4);
        }
        else {
          local_278 = 1;
        }
        local_274 = local_278;
      }
      if (local_274 == 0) {
        if (('/' < local_23) && (local_23 < ':')) {
          return 10;
        }
      }
      else {
        if (local_27 < 'F') {
          local_27c = -1;
        }
        else {
          if (local_27 < 'G') {
            local_280 = strncmp(&local_27,"FORM",4);
          }
          else {
            local_280 = 1;
          }
          local_27c = local_280;
        }
        if (local_27c == 0) {
          if (('/' < local_23) && (local_23 < ':')) {
            return 10;
          }
        }
        else {
          if (local_27 < 'B') {
            local_284 = -1;
          }
          else {
            if (local_27 < 'C') {
              local_288 = strncmp(&local_27,"BCOL",4);
            }
            else {
              local_288 = 1;
            }
            local_284 = local_288;
          }
          if (local_284 == 0) {
            if (('/' < local_23) && (local_23 < ':')) {
              return 10;
            }
          }
          else {
            if (local_27 < 'F') {
              local_28c = -1;
            }
            else {
              if (local_27 < 'G') {
                local_290 = strncmp(&local_27,"FIELDS ",7);
              }
              else {
                local_290 = 1;
              }
              local_28c = local_290;
            }
            if (local_28c == 0) {
              return 10;
            }
            if (local_27 < 'H') {
              local_294 = -1;
            }
            else {
              if (local_27 < 'I') {
                local_298 = strncmp(&local_27,"HEAP   ",7);
              }
              else {
                local_298 = 1;
              }
              local_294 = local_298;
            }
            if (local_294 == 0) {
              return 10;
            }
            if (local_27 < 'N') {
              local_29c = -1;
            }
            else {
              if (local_27 < 'O') {
                local_2a0 = strncmp(&local_27,"NULL",4);
              }
              else {
                local_2a0 = 1;
              }
              local_29c = local_2a0;
            }
            if (local_29c == 0) {
              if (('/' < local_23) && (local_23 < ':')) {
                return 0x28;
              }
            }
            else {
              if (local_27 < 'D') {
                local_2a4 = -1;
              }
              else {
                if (local_27 < 'E') {
                  local_2a8 = strncmp(&local_27,"DIM",3);
                }
                else {
                  local_2a8 = 1;
                }
                local_2a4 = local_2a8;
              }
              if (local_2a4 == 0) {
                if (('/' < local_24) && (local_24 < ':')) {
                  return 0x32;
                }
              }
              else {
                if (local_27 < 'U') {
                  local_2ac = -1;
                }
                else {
                  if (local_27 < 'V') {
                    local_2b0 = strncmp(&local_27,"UNIT",4);
                  }
                  else {
                    local_2b0 = 1;
                  }
                  local_2ac = local_2b0;
                }
                if (local_2ac == 0) {
                  if (('/' < local_23) && (local_23 < ':')) {
                    return 0x46;
                  }
                }
                else {
                  if (local_27 < 'D') {
                    local_2b4 = -1;
                  }
                  else {
                    if (local_27 < 'E') {
                      local_2b8 = strncmp(&local_27,"DISP",4);
                    }
                    else {
                      local_2b8 = 1;
                    }
                    local_2b4 = local_2b8;
                  }
                  if (local_2b4 == 0) {
                    if (('/' < local_23) && (local_23 < ':')) {
                      return 0x50;
                    }
                  }
                  else {
                    if (local_27 < 'S') {
                      local_2bc = -1;
                    }
                    else {
                      if (local_27 < 'T') {
                        local_2c0 = strncmp(&local_27,"SCAL",4);
                      }
                      else {
                        local_2c0 = 1;
                      }
                      local_2bc = local_2c0;
                    }
                    if (local_2bc == 0) {
                      if (('/' < local_23) && (local_23 < ':')) {
                        return 0x1e;
                      }
                    }
                    else {
                      if (local_27 < 'Z') {
                        local_2c4 = -1;
                      }
                      else {
                        if (local_27 < '[') {
                          local_2c8 = strncmp(&local_27,"ZERO",4);
                        }
                        else {
                          local_2c8 = 1;
                        }
                        local_2c4 = local_2c8;
                      }
                      if (local_2c4 == 0) {
                        if (('/' < local_23) && (local_23 < ':')) {
                          return 0x1e;
                        }
                      }
                      else {
                        if (local_27 < 'L') {
                          local_2cc = -1;
                        }
                        else {
                          if (local_27 < 'M') {
                            local_2d0 = strncmp(&local_27,"LMIN",4);
                          }
                          else {
                            local_2d0 = 1;
                          }
                          local_2cc = local_2d0;
                        }
                        if (local_2cc == 0) {
                          if (('/' < local_23) && (local_23 < ':')) {
                            return 0x3c;
                          }
                        }
                        else {
                          if (local_27 < 'L') {
                            local_2d4 = -1;
                          }
                          else {
                            if (local_27 < 'M') {
                              local_2d8 = strncmp(&local_27,"LMAX",4);
                            }
                            else {
                              local_2d8 = 1;
                            }
                            local_2d4 = local_2d8;
                          }
                          if (local_2d4 == 0) {
                            if (('/' < local_23) && (local_23 < ':')) {
                              return 0x3c;
                            }
                          }
                          else {
                            if (local_27 < 'D') {
                              local_2dc = -1;
                            }
                            else {
                              if (local_27 < 'E') {
                                local_2e0 = strncmp(&local_27,"DMIN",4);
                              }
                              else {
                                local_2e0 = 1;
                              }
                              local_2dc = local_2e0;
                            }
                            if (local_2dc == 0) {
                              if (('/' < local_23) && (local_23 < ':')) {
                                return 0x3c;
                              }
                            }
                            else {
                              if (local_27 < 'D') {
                                local_2e4 = -1;
                              }
                              else {
                                if (local_27 < 'E') {
                                  local_2e8 = strncmp(&local_27,"DMAX",4);
                                }
                                else {
                                  local_2e8 = 1;
                                }
                                local_2e4 = local_2e8;
                              }
                              if (local_2e4 == 0) {
                                if (('/' < local_23) && (local_23 < ':')) {
                                  return 0x3c;
                                }
                              }
                              else {
                                if (local_27 < 'C') {
                                  local_2ec = -1;
                                }
                                else {
                                  if (local_27 < 'D') {
                                    local_2f0 = strncmp(&local_27,"CTYP",4);
                                  }
                                  else {
                                    local_2f0 = 1;
                                  }
                                  local_2ec = local_2f0;
                                }
                                if (local_2ec == 0) {
                                  if (('/' < local_23) && (local_23 < ':')) {
                                    return 0x6e;
                                  }
                                }
                                else {
                                  if (local_27 < 'C') {
                                    local_2f4 = -1;
                                  }
                                  else {
                                    if (local_27 < 'D') {
                                      local_2f8 = strncmp(&local_27,"CTY",3);
                                    }
                                    else {
                                      local_2f8 = 1;
                                    }
                                    local_2f4 = local_2f8;
                                  }
                                  if (local_2f4 == 0) {
                                    if (('/' < local_24) && (local_24 < ':')) {
                                      return 0x6e;
                                    }
                                  }
                                  else {
                                    if (local_27 < 'C') {
                                      local_2fc = -1;
                                    }
                                    else {
                                      if (local_27 < 'D') {
                                        local_300 = strncmp(&local_27,"CUNI",4);
                                      }
                                      else {
                                        local_300 = 1;
                                      }
                                      local_2fc = local_300;
                                    }
                                    if (local_2fc == 0) {
                                      if (('/' < local_23) && (local_23 < ':')) {
                                        return 0x6e;
                                      }
                                    }
                                    else {
                                      if (local_27 < 'C') {
                                        local_304 = -1;
                                      }
                                      else {
                                        if (local_27 < 'D') {
                                          local_308 = strncmp(&local_27,"CUN",3);
                                        }
                                        else {
                                          local_308 = 1;
                                        }
                                        local_304 = local_308;
                                      }
                                      if (local_304 == 0) {
                                        if (('/' < local_24) && (local_24 < ':')) {
                                          return 0x6e;
                                        }
                                      }
                                      else {
                                        if (local_27 < 'C') {
                                          local_30c = -1;
                                        }
                                        else {
                                          if (local_27 < 'D') {
                                            local_310 = strncmp(&local_27,"CRVL",4);
                                          }
                                          else {
                                            local_310 = 1;
                                          }
                                          local_30c = local_310;
                                        }
                                        if (local_30c == 0) {
                                          if (('/' < local_23) && (local_23 < ':')) {
                                            return 0x6e;
                                          }
                                        }
                                        else {
                                          if (local_27 < 'C') {
                                            local_314 = -1;
                                          }
                                          else {
                                            if (local_27 < 'D') {
                                              local_318 = strncmp(&local_27,"CRV",3);
                                            }
                                            else {
                                              local_318 = 1;
                                            }
                                            local_314 = local_318;
                                          }
                                          if (local_314 == 0) {
                                            if (('/' < local_24) && (local_24 < ':')) {
                                              return 0x6e;
                                            }
                                          }
                                          else {
                                            if (local_27 < 'C') {
                                              local_31c = -1;
                                            }
                                            else {
                                              if (local_27 < 'D') {
                                                local_320 = strncmp(&local_27,"CRPX",4);
                                              }
                                              else {
                                                local_320 = 1;
                                              }
                                              local_31c = local_320;
                                            }
                                            if (local_31c == 0) {
                                              if (('/' < local_23) && (local_23 < ':')) {
                                                return 0x6e;
                                              }
                                            }
                                            else {
                                              if (local_27 < 'C') {
                                                local_324 = -1;
                                              }
                                              else {
                                                if (local_27 < 'D') {
                                                  local_328 = strncmp(&local_27,"CRP",3);
                                                }
                                                else {
                                                  local_328 = 1;
                                                }
                                                local_324 = local_328;
                                              }
                                              if (local_324 == 0) {
                                                if (('/' < local_24) && (local_24 < ':')) {
                                                  return 0x6e;
                                                }
                                              }
                                              else {
                                                if (local_27 < 'C') {
                                                  local_32c = -1;
                                                }
                                                else {
                                                  if (local_27 < 'D') {
                                                    local_330 = strncmp(&local_27,"CROT",4);
                                                  }
                                                  else {
                                                    local_330 = 1;
                                                  }
                                                  local_32c = local_330;
                                                }
                                                if (local_32c == 0) {
                                                  if (('/' < local_23) && (local_23 < ':')) {
                                                    return 0x6e;
                                                  }
                                                }
                                                else {
                                                  if (local_27 < 'C') {
                                                    local_334 = -1;
                                                  }
                                                  else {
                                                    if (local_27 < 'D') {
                                                      local_338 = strncmp(&local_27,"CDLT",4);
                                                    }
                                                    else {
                                                      local_338 = 1;
                                                    }
                                                    local_334 = local_338;
                                                  }
                                                  if (local_334 == 0) {
                                                    if (('/' < local_23) && (local_23 < ':')) {
                                                      return 0x6e;
                                                    }
                                                  }
                                                  else {
                                                    if (local_27 < 'C') {
                                                      local_33c = -1;
                                                    }
                                                    else {
                                                      if (local_27 < 'D') {
                                                        local_340 = strncmp(&local_27,"CDE",3);
                                                      }
                                                      else {
                                                        local_340 = 1;
                                                      }
                                                      local_33c = local_340;
                                                    }
                                                    if (local_33c == 0) {
                                                      if (('/' < local_24) && (local_24 < ':')) {
                                                        return 0x6e;
                                                      }
                                                    }
                                                    else {
                                                      if (local_27 < 'C') {
                                                        local_344 = -1;
                                                      }
                                                      else {
                                                        if (local_27 < 'D') {
                                                          local_348 = strncmp(&local_27,"CRD",3);
                                                        }
                                                        else {
                                                          local_348 = 1;
                                                        }
                                                        local_344 = local_348;
                                                      }
                                                      if (local_344 == 0) {
                                                        if (('/' < local_24) && (local_24 < ':')) {
                                                          return 0x6e;
                                                        }
                                                      }
                                                      else {
                                                        if (local_27 < 'C') {
                                                          local_34c = -1;
                                                        }
                                                        else {
                                                          if (local_27 < 'D') {
                                                            local_350 = strncmp(&local_27,"CSY",3);
                                                          }
                                                          else {
                                                            local_350 = 1;
                                                          }
                                                          local_34c = local_350;
                                                        }
                                                        if (local_34c == 0) {
                                                          if (('/' < local_24) && (local_24 < ':'))
                                                          {
                                                            return 0x6e;
                                                          }
                                                        }
                                                        else {
                                                          if (local_27 < 'W') {
                                                            local_354 = -1;
                                                          }
                                                          else {
                                                            if (local_27 < 'X') {
                                                              local_358 = strncmp(&local_27,"WCS",3)
                                                              ;
                                                            }
                                                            else {
                                                              local_358 = 1;
                                                            }
                                                            local_354 = local_358;
                                                          }
                                                          if (local_354 == 0) {
                                                            if (('/' < local_24) && (local_24 < ':')
                                                               ) {
                                                              return 0x6e;
                                                            }
                                                          }
                                                          else {
                                                            if (local_27 < 'C') {
                                                              local_35c = -1;
                                                            }
                                                            else {
                                                              if (local_27 < 'D') {
                                                                local_360 = strncmp(&local_27,"C",1)
                                                                ;
                                                              }
                                                              else {
                                                                local_360 = 1;
                                                              }
                                                              local_35c = local_360;
                                                            }
                                                            if (local_35c == 0) {
                                                              if (('/' < local_26) &&
                                                                 (local_26 < ':')) {
                                                                return 0x6e;
                                                              }
                                                            }
                                                            else {
                                                              if (local_27 < 'P') {
                                                                local_364 = -1;
                                                              }
                                                              else {
                                                                if (local_27 < 'Q') {
                                                                  local_368 = strncmp(&local_27,"P",
                                                                                      1);
                                                                }
                                                                else {
                                                                  local_368 = 1;
                                                                }
                                                                local_364 = local_368;
                                                              }
                                                              if (local_364 == 0) {
                                                                if (('/' < local_26) &&
                                                                   (local_26 < ':')) {
                                                                  return 0x6e;
                                                                }
                                                              }
                                                              else {
                                                                if (local_27 < 'V') {
                                                                  local_36c = -1;
                                                                }
                                                                else {
                                                                  if (local_27 < 'W') {
                                                                    local_370 = strncmp(&local_27,
                                                                                        "V",1);
                                                                  }
                                                                  else {
                                                                    local_370 = 1;
                                                                  }
                                                                  local_36c = local_370;
                                                                }
                                                                if (local_36c == 0) {
                                                                  if (('/' < local_26) &&
                                                                     (local_26 < ':')) {
                                                                    return 0x6e;
                                                                  }
                                                                }
                                                                else {
                                                                  if (local_27 < 'S') {
                                                                    local_374 = -1;
                                                                  }
                                                                  else {
                                                                    if (local_27 < 'T') {
                                                                      local_378 = strncmp(&local_27,
                                                                                          "S",1);
                                                                    }
                                                                    else {
                                                                      local_378 = 1;
                                                                    }
                                                                    local_374 = local_378;
                                                                  }
                                                                  if (((local_374 == 0) &&
                                                                      ('/' < local_26)) &&
                                                                     (local_26 < ':')) {
                                                                    return 0x6e;
                                                                  }
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (local_28 == 'X') {
      if (local_27 < 'T') {
        local_37c = -1;
      }
      else {
        if (local_27 < 'U') {
          local_380 = strncmp(&local_27,"TENSION",7);
        }
        else {
          local_380 = 1;
        }
        local_37c = local_380;
      }
      if (local_37c == 0) {
        return 10;
      }
    }
    else if (local_28 == 'W') {
      if (local_27 < 'C') {
        local_384 = -1;
      }
      else {
        if (local_27 < 'D') {
          local_388 = strncmp(&local_27,"CSAXES",6);
        }
        else {
          local_388 = 1;
        }
        local_384 = local_388;
      }
      if (local_384 == 0) {
        return 0x6e;
      }
      if (local_27 < 'C') {
        local_38c = -1;
      }
      else {
        if (local_27 < 'D') {
          local_390 = strncmp(&local_27,"CSNAME",6);
        }
        else {
          local_390 = 1;
        }
        local_38c = local_390;
      }
      if (local_38c == 0) {
        return 0x6e;
      }
      if (local_27 < 'C') {
        local_394 = -1;
      }
      else {
        if (local_27 < 'D') {
          local_398 = strncmp(&local_27,"CAX",3);
        }
        else {
          local_398 = 1;
        }
        local_394 = local_398;
      }
      if (local_394 == 0) {
        if (('/' < local_24) && (local_24 < ':')) {
          return 0x6e;
        }
      }
      else {
        if (local_27 < 'C') {
          local_39c = -1;
        }
        else {
          if (local_27 < 'D') {
            local_3a0 = strncmp(&local_27,"CSN",3);
          }
          else {
            local_3a0 = 1;
          }
          local_39c = local_3a0;
        }
        if (((local_39c == 0) && ('/' < local_24)) && (local_24 < ':')) {
          return 0x6e;
        }
      }
    }
    else if (('/' < local_28) && (local_28 < ':')) {
      if (local_27 == 'C') {
        iVar1 = strncmp(&local_27,"CTYP",4);
        if (iVar1 == 0) {
          if (('/' < local_23) && (local_23 < ':')) {
            return 0x6e;
          }
        }
        else {
          if (local_27 < 'C') {
            local_3ac = -1;
          }
          else {
            if (local_27 < 'D') {
              local_3b0 = strncmp(&local_27,"CTY",3);
            }
            else {
              local_3b0 = 1;
            }
            local_3ac = local_3b0;
          }
          if (local_3ac == 0) {
            if (('/' < local_24) && (local_24 < ':')) {
              return 0x6e;
            }
          }
          else {
            if (local_27 < 'C') {
              local_3b4 = -1;
            }
            else {
              if (local_27 < 'D') {
                local_3b8 = strncmp(&local_27,"CUNI",4);
              }
              else {
                local_3b8 = 1;
              }
              local_3b4 = local_3b8;
            }
            if (local_3b4 == 0) {
              if (('/' < local_23) && (local_23 < ':')) {
                return 0x6e;
              }
            }
            else {
              if (local_27 < 'C') {
                local_3bc = -1;
              }
              else {
                if (local_27 < 'D') {
                  local_3c0 = strncmp(&local_27,"CUN",3);
                }
                else {
                  local_3c0 = 1;
                }
                local_3bc = local_3c0;
              }
              if (local_3bc == 0) {
                if (('/' < local_24) && (local_24 < ':')) {
                  return 0x6e;
                }
              }
              else {
                if (local_27 < 'C') {
                  local_3c4 = -1;
                }
                else {
                  if (local_27 < 'D') {
                    local_3c8 = strncmp(&local_27,"CRVL",4);
                  }
                  else {
                    local_3c8 = 1;
                  }
                  local_3c4 = local_3c8;
                }
                if (local_3c4 == 0) {
                  if (('/' < local_23) && (local_23 < ':')) {
                    return 0x6e;
                  }
                }
                else {
                  if (local_27 < 'C') {
                    local_3cc = -1;
                  }
                  else {
                    if (local_27 < 'D') {
                      local_3d0 = strncmp(&local_27,"CRV",3);
                    }
                    else {
                      local_3d0 = 1;
                    }
                    local_3cc = local_3d0;
                  }
                  if (local_3cc == 0) {
                    if (('/' < local_24) && (local_24 < ':')) {
                      return 0x6e;
                    }
                  }
                  else {
                    if (local_27 < 'C') {
                      local_3d4 = -1;
                    }
                    else {
                      if (local_27 < 'D') {
                        local_3d8 = strncmp(&local_27,"CRPX",4);
                      }
                      else {
                        local_3d8 = 1;
                      }
                      local_3d4 = local_3d8;
                    }
                    if (local_3d4 == 0) {
                      if (('/' < local_23) && (local_23 < ':')) {
                        return 0x6e;
                      }
                    }
                    else {
                      if (local_27 < 'C') {
                        local_3dc = -1;
                      }
                      else {
                        if (local_27 < 'D') {
                          local_3e0 = strncmp(&local_27,"CRP",3);
                        }
                        else {
                          local_3e0 = 1;
                        }
                        local_3dc = local_3e0;
                      }
                      if (local_3dc == 0) {
                        if (('/' < local_24) && (local_24 < ':')) {
                          return 0x6e;
                        }
                      }
                      else {
                        if (local_27 < 'C') {
                          local_3e4 = -1;
                        }
                        else {
                          if (local_27 < 'D') {
                            local_3e8 = strncmp(&local_27,"CROT",4);
                          }
                          else {
                            local_3e8 = 1;
                          }
                          local_3e4 = local_3e8;
                        }
                        if (local_3e4 == 0) {
                          if (('/' < local_23) && (local_23 < ':')) {
                            return 0x6e;
                          }
                        }
                        else {
                          if (local_27 < 'C') {
                            local_3ec = -1;
                          }
                          else {
                            if (local_27 < 'D') {
                              local_3f0 = strncmp(&local_27,"CDLT",4);
                            }
                            else {
                              local_3f0 = 1;
                            }
                            local_3ec = local_3f0;
                          }
                          if (local_3ec == 0) {
                            if (('/' < local_23) && (local_23 < ':')) {
                              return 0x6e;
                            }
                          }
                          else {
                            if (local_27 < 'C') {
                              local_3f4 = -1;
                            }
                            else {
                              if (local_27 < 'D') {
                                local_3f8 = strncmp(&local_27,"CDE",3);
                              }
                              else {
                                local_3f8 = 1;
                              }
                              local_3f4 = local_3f8;
                            }
                            if (local_3f4 == 0) {
                              if (('/' < local_24) && (local_24 < ':')) {
                                return 0x6e;
                              }
                            }
                            else {
                              if (local_27 < 'C') {
                                local_3fc = -1;
                              }
                              else {
                                if (local_27 < 'D') {
                                  local_400 = strncmp(&local_27,"CRD",3);
                                }
                                else {
                                  local_400 = 1;
                                }
                                local_3fc = local_400;
                              }
                              if (local_3fc == 0) {
                                if (('/' < local_24) && (local_24 < ':')) {
                                  return 0x6e;
                                }
                              }
                              else {
                                if (local_27 < 'C') {
                                  local_404 = -1;
                                }
                                else {
                                  if (local_27 < 'D') {
                                    local_408 = strncmp(&local_27,"CSY",3);
                                  }
                                  else {
                                    local_408 = 1;
                                  }
                                  local_404 = local_408;
                                }
                                if (((local_404 == 0) && ('/' < local_24)) && (local_24 < ':')) {
                                  return 0x6e;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        if (local_27 < 'V') {
          iVar1 = -1;
        }
        else if (local_27 < 'W') {
          iVar1 = strncmp(&local_27,"V",1);
        }
        else {
          iVar1 = 1;
        }
        if (iVar1 == 0) {
          if (('/' < local_26) && (local_26 < ':')) {
            return 0x6e;
          }
        }
        else {
          if (local_27 < 'S') {
            local_414 = -1;
          }
          else {
            if (local_27 < 'T') {
              local_418 = strncmp(&local_27,"S",1);
            }
            else {
              local_418 = 1;
            }
            local_414 = local_418;
          }
          if (local_414 == 0) {
            if (('/' < local_26) && (local_26 < ':')) {
              return 0x6e;
            }
          }
          else if (('/' < local_27) && (local_27 < ':')) {
            if ((local_26 == 'P') && (local_25 == 'C')) {
              if (('/' < local_24) && (local_24 < ':')) {
                return 0x6e;
              }
            }
            else if ((((local_26 == 'C') && (local_25 == 'D')) && ('/' < local_24)) &&
                    (local_24 < ':')) {
              return 0x6e;
            }
          }
        }
      }
    }
  }
  return 0x96;
}

Assistant:

int ffgkcl(char *tcard)

/*
   Return the type classification of the input header record

   TYP_STRUC_KEY: SIMPLE, BITPIX, NAXIS, NAXISn, EXTEND, BLOCKED,
                  GROUPS, PCOUNT, GCOUNT, END
                  XTENSION, TFIELDS, TTYPEn, TBCOLn, TFORMn, THEAP,
                   and the first 4 COMMENT keywords in the primary array
                   that define the FITS format.

   TYP_CMPRS_KEY:
            The keywords used in the compressed image format
                  ZIMAGE, ZCMPTYPE, ZNAMEn, ZVALn, ZTILEn, 
                  ZBITPIX, ZNAXISn, ZSCALE, ZZERO, ZBLANK,
                  EXTNAME = 'COMPRESSED_IMAGE'
		  ZSIMPLE, ZTENSION, ZEXTEND, ZBLOCKED, ZPCOUNT, ZGCOUNT
		  ZQUANTIZ, ZDITHER0

   TYP_SCAL_KEY:  BSCALE, BZERO, TSCALn, TZEROn

   TYP_NULL_KEY:  BLANK, TNULLn

   TYP_DIM_KEY:   TDIMn

   TYP_RANG_KEY:  TLMINn, TLMAXn, TDMINn, TDMAXn, DATAMIN, DATAMAX

   TYP_UNIT_KEY:  BUNIT, TUNITn

   TYP_DISP_KEY:  TDISPn

   TYP_HDUID_KEY: EXTNAME, EXTVER, EXTLEVEL, HDUNAME, HDUVER, HDULEVEL

   TYP_CKSUM_KEY  CHECKSUM, DATASUM

   TYP_WCS_KEY:
           Primary array:
                  WCAXES, CTYPEn, CUNITn, CRVALn, CRPIXn, CROTAn, CDELTn
                  CDj_is, PVj_ms, LONPOLEs, LATPOLEs
  
           Pixel list:
                  TCTYPn, TCTYns, TCUNIn, TCUNns, TCRVLn, TCRVns, TCRPXn, TCRPks,
                  TCDn_k, TCn_ks, TPVn_m, TPn_ms, TCDLTn, TCROTn

           Bintable vector:
                  jCTYPn, jCTYns, jCUNIn, jCUNns, jCRVLn, jCRVns, iCRPXn, iCRPns,
                  jiCDn, jiCDns, jPVn_m, jPn_ms, jCDLTn, jCROTn
                
   TYP_REFSYS_KEY:
                   EQUINOXs, EPOCH, MJD-OBSs, RADECSYS, RADESYSs

   TYP_COMM_KEY:  COMMENT, HISTORY, (blank keyword)

   TYP_CONT_KEY:  CONTINUE

   TYP_USER_KEY:  all other keywords

*/ 
{
    char card[20], *card1, *card5;

    card[0] = '\0';
    strncat(card, tcard, 8);   /* copy the keyword name */
    strcat(card, "        "); /* append blanks to make at least 8 chars long */
    ffupch(card);  /* make sure it is in upper case */

    card1 = card + 1;  /* pointer to 2nd character */
    card5 = card + 5;  /* pointer to 6th character */

    /* the strncmp function is slow, so try to be more efficient */
    if (*card == 'Z')
    {
	if (FSTRNCMP (card1, "IMAGE  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "CMPTYPE", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "NAME", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "VAL", 3) == 0)
        {
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "TILE", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "BITPIX ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "NAXIS", 5) == 0)
        {
            if ( ( *(card + 6) >= '0' && *(card + 6) <= '9' )
             || (*(card + 6) == ' ') )
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "SCALE  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "ZERO   ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "BLANK  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "SIMPLE ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "TENSION", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "EXTEND ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "BLOCKED", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "PCOUNT ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "GCOUNT ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "QUANTIZ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "DITHER0", 7) == 0)
	    return (TYP_CMPRS_KEY);
    }
    else if (*card == ' ')
    {
	return (TYP_COMM_KEY);
    }
    else if (*card == 'B')
    {
	if (FSTRNCMP (card1, "ITPIX  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "LOCKED ", 7) == 0)
	    return (TYP_STRUC_KEY);

	if (FSTRNCMP (card1, "LANK   ", 7) == 0)
	    return (TYP_NULL_KEY);

	if (FSTRNCMP (card1, "SCALE  ", 7) == 0)
	    return (TYP_SCAL_KEY);
	if (FSTRNCMP (card1, "ZERO   ", 7) == 0)
	    return (TYP_SCAL_KEY);

	if (FSTRNCMP (card1, "UNIT   ", 7) == 0)
	    return (TYP_UNIT_KEY);
    }
    else if (*card == 'C')
    {
	if (FSTRNCMP (card1, "OMMENT",6) == 0)
	{
          /* new comment string starting Oct 2001 */
	    if (FSTRNCMP (tcard, "COMMENT   and Astrophysics', volume 376, page 3",
              47) == 0)
	        return (TYP_STRUC_KEY);

         /* original COMMENT strings from 1993 - 2001 */
	    if (FSTRNCMP (tcard, "COMMENT   FITS (Flexible Image Transport System",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   Astrophysics Supplement Series v44/p3",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   Contact the NASA Science Office of St",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   FITS Definition document #100 and oth",
              47) == 0)
	        return (TYP_STRUC_KEY);

            if (*(card + 7) == ' ')
	        return (TYP_COMM_KEY);
            else
                return (TYP_USER_KEY);
	}

	if (FSTRNCMP (card1, "HECKSUM", 7) == 0)
	    return (TYP_CKSUM_KEY);

	if (FSTRNCMP (card1, "ONTINUE", 7) == 0)
	    return (TYP_CONT_KEY);

	if (FSTRNCMP (card1, "TYPE",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "UNIT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RVAL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RPIX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "ROTA",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RDER",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "SYER",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "DELT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'D')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'D')
    {
	if (FSTRNCMP (card1, "ATASUM ", 7) == 0)
	    return (TYP_CKSUM_KEY);
	if (FSTRNCMP (card1, "ATAMIN ", 7) == 0)
	    return (TYP_RANG_KEY);
	if (FSTRNCMP (card1, "ATAMAX ", 7) == 0)
	    return (TYP_RANG_KEY);
	if (FSTRNCMP (card1, "ATE-OBS", 7) == 0)
	    return (TYP_REFSYS_KEY);    }
    else if (*card == 'E')
    {
	if (FSTRNCMP (card1, "XTEND  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "ND     ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "XTNAME ", 7) == 0)
	{
            /* check for special compressed image value */
            if (FSTRNCMP(tcard, "EXTNAME = 'COMPRESSED_IMAGE'", 28) == 0)
	      return (TYP_CMPRS_KEY);
            else
	      return (TYP_HDUID_KEY);
	}
	if (FSTRNCMP (card1, "XTVER  ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "XTLEVEL", 7) == 0)
	    return (TYP_HDUID_KEY);

	if (FSTRNCMP (card1, "QUINOX", 6) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "QUI",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_REFSYS_KEY);
        }
	if (FSTRNCMP (card1, "POCH   ", 7) == 0)
	    return (TYP_REFSYS_KEY);
    }
    else if (*card == 'G')
    {
	if (FSTRNCMP (card1, "COUNT  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "ROUPS  ", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'H')
    {
	if (FSTRNCMP (card1, "DUNAME ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "DUVER  ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "DULEVEL", 7) == 0)
	    return (TYP_HDUID_KEY);

	if (FSTRNCMP (card1, "ISTORY",6) == 0)
        {
            if (*(card + 7) == ' ')
	        return (TYP_COMM_KEY);
            else
                return (TYP_USER_KEY);
        }
    }
    else if (*card == 'L')
    {
	if (FSTRNCMP (card1, "ONPOLE",6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "ATPOLE",6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "ONP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "ATP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'M')
    {
	if (FSTRNCMP (card1, "JD-OBS ", 7) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "JDOB",4) == 0)
        {
            if (*(card+5) >= '0' && *(card+5) <= '9')
	        return (TYP_REFSYS_KEY);
        }
    }
    else if (*card == 'N')
    {
	if (FSTRNCMP (card1, "AXIS", 4) == 0)
        {
            if ((*card5 >= '0' && *card5 <= '9')
             || (*card5 == ' '))
	        return (TYP_STRUC_KEY);
        }
    }
    else if (*card == 'P')
    {
	if (FSTRNCMP (card1, "COUNT  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (*card1 == 'C')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'V')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'S')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'R')
    {
	if (FSTRNCMP (card1, "ADECSYS", 7) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "ADESYS", 6) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "ADE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_REFSYS_KEY);
        }
    }
    else if (*card == 'S')
    {
	if (FSTRNCMP (card1, "IMPLE  ", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'T')
    {
	if (FSTRNCMP (card1, "TYPE", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "FORM", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "BCOL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "FIELDS ", 7) == 0)
	    return (TYP_STRUC_KEY);
	else if (FSTRNCMP (card1, "HEAP   ", 7) == 0)
	    return (TYP_STRUC_KEY);

	else if (FSTRNCMP (card1, "NULL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_NULL_KEY);
        }

	else if (FSTRNCMP (card1, "DIM", 3) == 0)
        {
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
 	        return (TYP_DIM_KEY);
        }

	else if (FSTRNCMP (card1, "UNIT", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_UNIT_KEY);
        }

	else if (FSTRNCMP (card1, "DISP", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_DISP_KEY);
        }

	else if (FSTRNCMP (card1, "SCAL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_SCAL_KEY);
        }
	else if (FSTRNCMP (card1, "ZERO", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_SCAL_KEY);
        }

	else if (FSTRNCMP (card1, "LMIN", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "LMAX", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "DMIN", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "DMAX", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }

	else if (FSTRNCMP (card1, "CTYP",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CTY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUNI",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUN",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRVL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRV",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRPX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CROT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDLT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRD",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "WCS",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "C",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "P",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "V",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "S",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'X')
    {
	if (FSTRNCMP (card1, "TENSION", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'W')
    {
	if (FSTRNCMP (card1, "CSAXES", 6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "CSNAME", 6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "CAX", 3) == 0)
	{
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSN", 3) == 0)
	{
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    
    else if (*card >= '0' && *card <= '9')
    {
      if (*card1 == 'C')
      {
        if (FSTRNCMP (card1, "CTYP",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CTY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUNI",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUN",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRVL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRV",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRPX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CROT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDLT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRD",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
      }
      else if (FSTRNCMP (card1, "V",1) == 0)
      {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
      }
      else if (FSTRNCMP (card1, "S",1) == 0)
      {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
      }
      else if (*card1 >= '0' && *card1 <= '9')
      {   /* 2 digits at beginning of keyword */
	
	    if ( (*(card + 2) == 'P') && (*(card + 3) == 'C') )
	    {
               if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);  /*  ijPCn keyword */
            }
	    else if ( (*(card + 2) == 'C') && (*(card + 3) == 'D') )
	    {
               if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);  /*  ijCDn keyword */
            }
      }
      
    }
    
    return (TYP_USER_KEY);  /* by default all others are user keywords */
}